

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  ulong uVar3;
  size_t sVar4;
  short sVar6;
  ushort uVar7;
  undefined1 auVar8 [16];
  Vector3f wiRender;
  undefined8 uVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  DebugMLTSampler *this_00;
  ExhaustiveLightSampler *this_01;
  HaltonSampler *this_02;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  Float u;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar18 [16];
  undefined8 uVar17;
  undefined1 auVar19 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar29 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar28 [64];
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar34 [56];
  float fVar35;
  Vector3f woRender;
  SampledSpectrum SVar36;
  Vector3f wiRender_00;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum f;
  LightLiSample ls;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  BSDF *local_1b8;
  float local_1ac;
  float local_1a8;
  float fStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  Interval<float> local_198;
  Interval<float> IStack_190;
  Interval<float> IStack_188;
  undefined8 uStack_180;
  float local_178;
  undefined8 local_174;
  float local_16c;
  Interval<float> local_168;
  Interval<float> IStack_160;
  Interval<float> IStack_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_144;
  float local_13c;
  undefined4 local_12c;
  Interval<float> *local_128;
  undefined8 *puStack_120;
  undefined8 *puStack_118;
  undefined4 *puStack_110;
  undefined1 local_108 [44];
  float local_dc;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  anon_struct_8_0_00000001_for___align local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar20 [64];
  undefined1 auVar27 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar33 [64];
  
  auVar18 = in_ZMM1._0_16_;
  local_108._16_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  local_108._0_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  local_108._8_8_ =
       (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  uVar2 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar5 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_108._32_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_108._36_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_108._40_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_dc = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_168 = (Interval<float>)
              (sampler->
              super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
  local_1b8 = bsdf;
  local_108._24_4_ = uVar2;
  local_108._28_4_ = uVar5;
  u = detail::DispatchSplit<8>::operator()
                ((DispatchSplit<8> *)&local_128,&local_168,(ulong)local_168 >> 0x30);
  uVar3 = (this->lightSampler).
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits;
  this_01 = (ExhaustiveLightSampler *)(uVar3 & 0xffffffffffff);
  sVar6 = (short)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 3) {
    if (sVar6 == 2) {
      PowerLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_1d8,(PowerLightSampler *)this_01,u);
    }
    else {
      sVar4 = (this_01->lights).nStored;
      if (sVar4 == 0) {
        local_1d8._0_12_ = ZEXT412(0);
        local_1d8._12_4_ = 0;
        local_1c8._0_1_ = false;
        local_1c8._1_7_ = 0;
      }
      else {
        auVar18 = vcvtusi2ss_avx512f(auVar18,sVar4);
        iVar13 = (int)(u * auVar18._0_4_);
        iVar12 = (int)sVar4 + -1;
        if (iVar13 <= iVar12) {
          iVar12 = iVar13;
        }
        local_1c8._0_1_ = true;
        local_1d8._8_4_ = 1.0 / auVar18._0_4_;
        local_1d8._0_8_ =
             (this_01->lights).ptr[iVar12].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
      }
    }
  }
  else if (sVar6 == 3) {
    BVHLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1d8,(BVHLightSampler *)this_01,
               (LightSampleContext *)local_108,u);
  }
  else {
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_1d8,this_01,(LightSampleContext *)local_108,u);
  }
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  uVar7 = (ushort)(uVar3 >> 0x30);
  if (uVar3 >> 0x30 < 5) {
    this_02 = (HaltonSampler *)(uVar3 & 0xffffffffffff);
    if (uVar3 < 0x3000000000000) {
      if (uVar7 == 2) {
        auVar20._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_02);
        auVar20._8_56_ = extraout_var_00;
        auVar18 = auVar20._0_16_;
      }
      else {
        auVar24._0_8_ = HaltonSampler::Get2D(this_02);
        auVar24._8_56_ = extraout_var_04;
        auVar18 = auVar24._0_16_;
      }
    }
    else if (uVar7 == 3) {
      auVar22._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_02);
      auVar22._8_56_ = extraout_var_02;
      auVar18 = auVar22._0_16_;
    }
    else {
      auVar26._0_8_ = RandomSampler::Get2D((RandomSampler *)this_02);
      auVar26._8_56_ = extraout_var_06;
      auVar18 = auVar26._0_16_;
    }
  }
  else {
    this_00 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
    if (uVar7 < 7) {
      if (uVar7 == 6) {
        auVar21._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_00);
        auVar21._8_56_ = extraout_var_01;
        auVar18 = auVar21._0_16_;
      }
      else {
        auVar25._0_8_ = SobolSampler::Get2D((SobolSampler *)this_00);
        auVar25._8_56_ = extraout_var_05;
        auVar18 = auVar25._0_16_;
      }
    }
    else if (uVar7 == 7) {
      auVar23._0_8_ = MLTSampler::Get2D((MLTSampler *)this_00);
      auVar23._8_56_ = extraout_var_03;
      auVar18 = auVar23._0_16_;
    }
    else {
      local_1a8 = DebugMLTSampler::Get1D(this_00);
      fStack_1a4 = (float)extraout_XMM0_Db;
      uStack_1a0 = extraout_XMM0_Dc;
      uStack_19c = extraout_XMM0_Dd;
      auVar28._0_4_ = DebugMLTSampler::Get1D(this_00);
      auVar28._4_60_ = extraout_var;
      auVar18._4_4_ = fStack_1a4;
      auVar18._0_4_ = local_1a8;
      auVar18._8_4_ = uStack_1a0;
      auVar18._12_4_ = uStack_19c;
      auVar18 = vinsertps_avx(auVar18,auVar28._0_16_,0x10);
    }
  }
  uVar17 = 0;
  uVar30 = 0;
  if (local_1c8._0_1_ != false) {
    uVar9 = local_1d8._0_8_;
    IStack_188 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    local_198 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    IStack_190 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    uStack_180._0_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uStack_180._4_4_ = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_178 = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_174._0_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_174._4_4_ = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_16c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_58 = *(undefined8 *)(lambda->lambda).values;
    uStack_50 = *(undefined8 *)((lambda->lambda).values + 2);
    uStack_48 = *(undefined8 *)(lambda->pdf).values;
    uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
    puStack_118 = &local_58;
    puStack_120 = &local_68;
    local_68 = vmovlps_avx(auVar18);
    puStack_110 = &local_12c;
    local_12c = 0;
    local_60 = (anon_struct_8_0_00000001_for___align)local_1d8._0_8_;
    local_168 = local_198;
    IStack_160 = IStack_190;
    IStack_158 = IStack_188;
    uStack_150 = uStack_180;
    local_148 = local_178;
    local_144 = local_174;
    local_13c = local_16c;
    local_128 = &local_168;
    detail::DispatchSplit<9>::operator()((LightSampleContext *)local_108);
    uVar10 = local_108._24_4_;
    uVar17 = 0;
    if ((float)local_108._28_4_ <= 0.0) {
      uVar30 = 0;
    }
    else {
      if (((float)local_108._0_4_ == 0.0) && (!NAN((float)local_108._0_4_))) {
        uVar3 = 0;
        while (uVar14 = uVar3, uVar14 != 3) {
          fVar16 = *(float *)((long)&((LightSampleContext *)local_108)->pi + uVar14 * 4 + 4);
          if ((fVar16 != 0.0) || (uVar3 = uVar14 + 1, NAN(fVar16))) break;
        }
        uVar30 = 0;
        if (2 < uVar14) goto LAB_0040ebf2;
      }
      pVVar1 = &(intr->super_Interaction).wo;
      local_78._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      local_78._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_1ac = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_108._24_4_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._16_4_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._20_4_;
      uStack_70 = 0;
      local_1a8 = (float)local_108._16_8_;
      fStack_1a4 = SUB84(local_108._16_8_,4);
      uStack_1a0 = 0;
      uStack_19c = 0;
      auVar34 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar29 = ZEXT856(0);
      SVar36 = BSDF::f(local_1b8,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,
                       Radiance);
      auVar33._0_8_ = SVar36.values.values._8_8_;
      auVar33._8_56_ = auVar34;
      auVar27._0_8_ = SVar36.values.values._0_8_;
      auVar27._8_56_ = auVar29;
      fVar16 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar18 = vmovlhps_avx(auVar27._0_16_,auVar33._0_16_);
      auVar8._4_4_ = fStack_1a4;
      auVar8._0_4_ = local_1a8;
      auVar8._8_4_ = uStack_1a0;
      auVar8._12_4_ = uStack_19c;
      auVar15 = vmovshdup_avx(auVar8);
      auVar31 = ZEXT416((uint)((float)uVar10 * fVar16));
      auVar15 = vfmadd132ss_fma(auVar15,auVar31,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y
                                       ));
      auVar31 = vfmsub213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)uVar10),auVar31);
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ + auVar31._0_4_)),auVar8,
                                ZEXT416((uint)(intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x
                                       ));
      auVar31._0_4_ = auVar15._0_4_;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(auVar31,auVar15);
      local_168.low = auVar15._0_4_ * auVar18._0_4_;
      local_168.high = auVar15._4_4_ * auVar18._4_4_;
      IStack_160.low = auVar15._8_4_ * auVar18._8_4_;
      IStack_160.high = auVar15._12_4_ * auVar18._12_4_;
      if ((local_168.low == 0.0) && (!NAN(local_168.low))) {
        uVar3 = 0;
        while (uVar14 = uVar3, uVar14 != 3) {
          fVar16 = *(float *)((long)&local_168.high + uVar14 * 4);
          if ((fVar16 != 0.0) || (uVar3 = uVar14 + 1, NAN(fVar16))) break;
        }
        uVar17 = 0;
        uVar30 = 0;
        if (2 < uVar14) goto LAB_0040ebf2;
      }
      bVar11 = Integrator::Unoccluded
                         ((Integrator *)this,&intr->super_Interaction,
                          (Interaction *)((long)&((LightSampleContext *)local_108)->ns + 4));
      uVar17 = 0;
      uVar30 = 0;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_1a4;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_1a8;
      if (bVar11) {
        if (local_1c8._0_1_ == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
        }
        fVar16 = (float)local_1d8._8_4_ * (float)local_108._28_4_;
        if (*(uint *)(uVar9 & 0xffffffffffff) < 2) {
          auVar19._0_4_ = (float)local_108._0_4_ * local_168.low;
          auVar19._4_4_ = (float)local_108._4_4_ * local_168.high;
          auVar19._8_4_ = (float)local_108._8_4_ * IStack_160.low;
          auVar19._12_4_ = (float)local_108._12_4_ * IStack_160.high;
          auVar32._4_4_ = fVar16;
          auVar32._0_4_ = fVar16;
          auVar32._8_4_ = fVar16;
          auVar32._12_4_ = fVar16;
        }
        else {
          local_88 = ZEXT416((uint)fVar16);
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_1ac;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_78;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_78._4_4_;
          wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar10;
          local_1a8 = BSDF::PDF(local_1b8,woRender,wiRender_00,Radiance,All);
          if ((SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
               ::reg == '\0') &&
             (iVar12 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                            ::reg), iVar12 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                        ::reg,SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                              ::StatsAccumulator__,(PixelAccumFunc)0x0);
            __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0x338) = *(long *)(in_FS_OFFSET + -0x338) + 1;
          if (((local_1a8 == 0.0) && (!NAN(local_1a8))) &&
             (1 < *(ushort *)
                   ((long)&(local_1b8->bxdf).
                           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                           .bits + 6) - 3)) {
            *(long *)(in_FS_OFFSET + -0x340) = *(long *)(in_FS_OFFSET + -0x340) + 1;
          }
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_1a8 * local_1a8)),local_88,local_88);
          fVar35 = local_88._0_4_;
          fVar16 = (fVar35 * fVar35) / auVar18._0_4_;
          auVar19._0_4_ = fVar16 * (float)local_108._0_4_ * local_168.low;
          auVar19._4_4_ = fVar16 * (float)local_108._4_4_ * local_168.high;
          auVar19._8_4_ = fVar16 * (float)local_108._8_4_ * IStack_160.low;
          auVar19._12_4_ = fVar16 * (float)local_108._12_4_ * IStack_160.high;
          auVar32._4_4_ = fVar35;
          auVar32._0_4_ = fVar35;
          auVar32._8_4_ = fVar35;
          auVar32._12_4_ = fVar35;
        }
        auVar18 = vdivps_avx(auVar19,auVar32);
        uVar17 = auVar18._0_8_;
        auVar18 = vshufpd_avx(auVar18,auVar18,1);
        uVar30 = auVar18._0_8_;
      }
    }
  }
LAB_0040ebf2:
  SVar36.values.values[2] = (float)(int)uVar30;
  SVar36.values.values[3] = (float)(int)((ulong)uVar30 >> 0x20);
  SVar36.values.values[0] = (float)(int)uVar17;
  SVar36.values.values[1] = (float)(int)((ulong)uVar17 >> 0x20);
  return (SampledSpectrum)SVar36.values.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);

    // Sample a point on the light source for direct lighting
    LightLiSample ls = light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls.wi;
    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls.pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls.pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls.L / lightPDF;
    else {
        Float bsdfPDF = bsdf.PDF(wo, wi);
        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false && bsdfPDF == 0);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls.L * weight / lightPDF;
    }
}